

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O2

void __thiscall
xemmai::t_shared_lock_with_safe_region<std::shared_mutex>::t_shared_lock_with_safe_region
          (t_shared_lock_with_safe_region<std::shared_mutex> *this,shared_mutex *a_mutex)

{
  t_safe_region region;
  t_safe_region local_11;
  
  (this->super_shared_lock<std::shared_mutex>)._M_pm = a_mutex;
  (this->super_shared_lock<std::shared_mutex>)._M_owns = false;
  t_safe_region::t_safe_region(&local_11);
  std::shared_lock<std::shared_mutex>::lock(&this->super_shared_lock<std::shared_mutex>);
  t_safe_region::~t_safe_region(&local_11);
  return;
}

Assistant:

t_shared_lock_with_safe_region(T& a_mutex) : std::shared_lock<T>(a_mutex, std::defer_lock)
	{
		t_safe_region region;
		this->lock();
	}